

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::LimitQueryCase::iterate(LimitQueryCase *this)

{
  TestLog *log;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  CallLogWrapper gl;
  ResultCollector result;
  string local_a0;
  CallLogWrapper local_80;
  ResultCollector local_68;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0x9b);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_80,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_68,log,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80.m_enableLog = true;
  gls::StateQueryUtil::verifyStateIntegerMin
            (&local_68,&local_80,this->m_target,this->m_minValue,this->m_type);
  tcu::ResultCollector::setTestContextResult
            (&local_68,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
    operator_delete(local_68.m_message._M_dataplus._M_p,
                    local_68.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_prefix._M_dataplus._M_p != &local_68.m_prefix.field_2) {
    operator_delete(local_68.m_prefix._M_dataplus._M_p,
                    local_68.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_80);
  return STOP;
}

Assistant:

LimitQueryCase::IterateResult LimitQueryCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_BOOLEAN);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_INTEGER64);
		verifyStateIntegerMin(result, gl, m_target, m_minValue, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}